

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  char *pcVar1;
  long *plVar2;
  uint16_t uVar3;
  __uid_t _Var4;
  uint uVar5;
  uint uVar6;
  ixy_device *piVar7;
  char *pcVar8;
  uint *puVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  pkt_buf *ppVar13;
  ixy_device *piVar14;
  uint in_ECX;
  uint uVar15;
  int iVar16;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar17;
  ixgbe_device *dev;
  uint uVar18;
  undefined6 in_register_00000032;
  uint uVar19;
  mempool *pmVar20;
  mempool *mempool;
  ulong uVar21;
  ushort uVar22;
  ulong uVar23;
  ulong uVar24;
  long *plVar25;
  uint uVar26;
  ulong uVar27;
  bool bVar28;
  ushort uStack_ec;
  
  uVar17 = CONCAT62(in_register_00000032,rx_queues);
  pmVar20 = (mempool *)(CONCAT62(in_register_00000012,tx_queues) & 0xffffffff);
  _Var4 = getuid();
  if (_Var4 != 0) {
    ixgbe_init_cold_1();
  }
  if (rx_queues < 0x41) {
    if ((ushort)pmVar20 < 0x41) {
      piVar7 = (ixy_device *)malloc(0x58);
      pcVar8 = strdup(pci_addr);
      piVar7->pci_addr = pcVar8;
      piVar7->driver_name = driver_name;
      piVar7->num_rx_queues = rx_queues;
      piVar7->num_tx_queues = (ushort)pmVar20;
      piVar7->rx_batch = ixgbe_rx_batch;
      piVar7->tx_batch = ixgbe_tx_batch;
      piVar7->read_stats = ixgbe_read_stats;
      piVar7->set_promisc = ixgbe_set_promisc;
      piVar7->get_link_speed = ixgbe_get_link_speed;
      puVar9 = (uint *)pci_map_resource(pci_addr);
      piVar7[1].pci_addr = (char *)puVar9;
      pcVar8 = (char *)calloc((ulong)rx_queues,0x8018);
      piVar7[1].driver_name = pcVar8;
      pvVar10 = calloc((ulong)tx_queues,0x8010);
      *(void **)&piVar7[1].num_rx_queues = pvVar10;
      pcVar8 = piVar7->pci_addr;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xe2,"reset_and_init",pcVar8);
      puVar9[0x222] = 0x7fffffff;
      *puVar9 = 0x4000008;
      if ((*puVar9 & 0x4000008) != 0) {
        ixgbe_init_cold_2();
      }
      usleep(10000);
      puVar9[0x222] = 0x7fffffff;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xee,"reset_and_init",pcVar8);
      if ((puVar9[0x4004] >> 9 & 1) == 0) {
        ixgbe_init_cold_3();
      }
      if ((puVar9[0xbc0] & 8) == 0) {
        ixgbe_init_cold_4();
      }
      puVar9[0x10a8] = puVar9[0x10a8] & 0xffff1fff | 0x6000;
      puVar9[0x10a8] = puVar9[0x10a8] & 0xfffffe7f;
      puVar9[0x10a8] = puVar9[0x10a8] | 0x1000;
      puVar9[0xc00] = puVar9[0xc00] & 0xfffffffe;
      puVar9[0xf00] = 0x20000;
      lVar11 = 0;
      do {
        puVar9[lVar11 + 0xf01] = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 7);
      puVar9[0x1090] = puVar9[0x1090] | 2;
      puVar9[0xbc0] = puVar9[0xbc0] | 2;
      puVar9[0x1420] = puVar9[0x1420] | 0x400;
      if (rx_queues != 0) {
        ixgbe_init_cold_5();
      }
      pcVar8 = piVar7[1].pci_addr;
      *(uint *)(pcVar8 + 0x18) = *(uint *)(pcVar8 + 0x18) | 0x10000;
      uVar22 = piVar7->num_rx_queues;
      if (uVar22 != 0) {
        uVar5 = 0;
        uVar15 = 0x2200;
        do {
          uVar18 = uVar15;
          if (0xf < uVar5) {
            if (uVar5 < 0x40) {
              uVar18 = uVar5 * 0x40 | 0x100c;
            }
            else {
              uVar18 = uVar5 * 0x40 + 0xc00c;
            }
          }
          *(uint *)(pcVar8 + (int)uVar18) = *(uint *)(pcVar8 + (int)uVar18) & 0xffffefff;
          uVar5 = uVar5 + 1;
          uVar15 = uVar15 + 4;
        } while (uVar22 != uVar5);
      }
      *(uint *)(pcVar8 + 0x3000) = *(uint *)(pcVar8 + 0x3000) | 1;
      *(uint *)(pcVar8 + 0x4240) = *(uint *)(pcVar8 + 0x4240) | 0x401;
      pcVar8[0xcc00] = '\0';
      pcVar8[0xcc01] = -0x60;
      pcVar8[0xcc02] = '\0';
      pcVar8[0xcc03] = '\0';
      lVar11 = 0x3301;
      do {
        pcVar1 = pcVar8 + lVar11 * 4;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x3308);
      pcVar8[0x8100] = -1;
      pcVar8[0x8101] = -1;
      pcVar8[0x8102] = '\0';
      pcVar8[0x8103] = '\0';
      *(uint *)(pcVar8 + 0x4900) = *(uint *)(pcVar8 + 0x4900) & 0xffffffbf;
      uVar3 = piVar7->num_tx_queues;
      if (uVar3 != 0) {
        ixgbe_init_cold_6();
      }
      pcVar8[0x4a80] = '\x01';
      pcVar8[0x4a81] = '\0';
      pcVar8[0x4a82] = '\0';
      pcVar8[0x4a83] = '\0';
      if (uVar22 != 0) {
        ixgbe_init_cold_7();
      }
      if (uVar3 != 0) {
        ixgbe_init_cold_8();
      }
      uVar5 = 0;
      fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0x143,"ixgbe_set_promisc");
      *(uint *)(pcVar8 + 0x5080) = *(uint *)(pcVar8 + 0x5080) | 0x300;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xd4,"wait_for_link");
      if (((byte)(*(uint *)(pcVar8 + 0x42a4) >> 0x1e) &
          (*(uint *)(pcVar8 + 0x42a4) & 0x30000000) != 0) == 0) {
        iVar16 = -9900000;
        do {
          usleep(100000);
          if (((byte)(*(uint *)(pcVar8 + 0x42a4) >> 0x1e) &
              (*(uint *)(pcVar8 + 0x42a4) & 0x30000000) != 0) != 0) break;
          bVar28 = iVar16 != 0;
          iVar16 = iVar16 + 100000;
        } while (bVar28);
      }
      if ((*(uint *)(pcVar8 + 0x42a4) >> 0x1e & 1) != 0) {
        uVar5 = *(uint *)(&DAT_001067b8 + (*(uint *)(pcVar8 + 0x42a4) >> 0x1a & 0xc));
      }
      fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xdc,"wait_for_link",(ulong)uVar5);
      return piVar7;
    }
  }
  else {
    ixgbe_init_cold_10();
  }
  ixgbe_init_cold_9();
  plVar2 = (long *)((long)pmVar20[3].base_addr + (uVar17 & 0xffffffff) * 0x18);
  uVar22 = *(ushort *)((long)plVar2 + 0x12);
  uVar12 = (ulong)uVar22;
  uVar5 = (uint)uVar22;
  if (in_ECX == 0) {
    uVar21 = 0;
LAB_00104274:
    if (uVar22 != (ushort)uVar5) {
      uVar18 = (int)uVar17 * 0x40;
      uVar15 = uVar18 + 0xc018;
      if ((ushort)uVar17 < 0x40) {
        uVar15 = uVar18 | 0x1018;
      }
      *(uint *)(*(long *)&pmVar20[2].free_stack_top + (ulong)uVar15) = uVar5 & 0xffff;
      *(ushort *)((long)plVar2 + 0x12) = uVar22;
    }
    return (ixy_device *)(uVar21 & 0xffffffff);
  }
  uVar27 = 0;
  mempool = pmVar20;
  uVar23 = uVar12;
  while( true ) {
    uVar21 = uVar23 & 0xffff;
    uVar5 = (int)uVar21 << 4;
    uVar15 = *(uint *)(*plVar2 + 8 + (ulong)uVar5);
    uVar24 = uVar23;
    if ((uVar15 & 1) != 0) break;
LAB_0010424e:
    uVar22 = (ushort)uVar24;
    uVar5 = (uint)uVar12;
    uVar21 = uVar27;
    if (((uVar15 & 1) == 0) ||
       (uVar27 = uVar27 + 1, uVar23 = uVar24, uVar21 = (ulong)in_ECX, in_ECX == uVar27))
    goto LAB_00104274;
  }
  if ((uVar15 & 2) != 0) {
    plVar25 = (long *)(*plVar2 + (ulong)uVar5);
    uVar5 = (uint)*(ushort *)((long)plVar25 + 0xe);
    lVar11 = plVar2[uVar21 + 3];
    *(uint *)(lVar11 + 0x14) = (uint)*(ushort *)((long)plVar25 + 0xc);
    mempool = (mempool *)plVar2[1];
    uVar18 = uVar15;
    ppVar13 = pkt_buf_alloc(mempool);
    if (ppVar13 != (pkt_buf *)0x0) {
      *plVar25 = ppVar13->buf_addr_phy + 0x40;
      plVar25[1] = 0;
      plVar2[uVar21 + 3] = (long)ppVar13;
      *(long *)(extraout_RDX + uVar27 * 8) = lVar11;
      uVar24 = (ulong)((int)plVar2[2] - 1U & (int)uVar23 + 1U);
      uVar12 = uVar23;
      goto LAB_0010424e;
    }
    uVar15 = uVar18;
    ixgbe_rx_batch_cold_1();
  }
  ixgbe_rx_batch_cold_2();
  lVar11 = *(long *)&mempool[3].buf_size;
  uVar17 = (ulong)(uVar15 << 4);
  plVar2 = (long *)(lVar11 + uVar17);
  uVar18 = (uint)*(ushort *)(lVar11 + 10 + uVar17);
  uVar22 = *(ushort *)(lVar11 + 0xc + uVar17);
  do {
    uVar6 = uVar18 & 0xffff;
    iVar16 = uVar22 - uVar6;
    if (iVar16 < 0) {
      iVar16 = iVar16 + (uint)*(ushort *)(plVar2 + 1);
    }
    bVar28 = false;
    if (0x1f < iVar16) {
      uVar26 = (uint)*(ushort *)(plVar2 + 1);
      if (uVar6 + 0x1f < (uint)*(ushort *)(plVar2 + 1)) {
        uVar26 = 0;
      }
      uVar26 = (uVar6 + 0x1f) - uVar26;
      if ((*(uint *)(*plVar2 + 0xc + (long)(int)uVar26 * 0x10) & 1) != 0) {
        for (; pkt_buf_free((pkt_buf *)plVar2[(ulong)uVar6 + 2]), uVar6 != uVar26;
            uVar6 = (int)plVar2[1] - 1U & uVar6 + 1 & 0xffff) {
        }
        uVar18 = (int)plVar2[1] - 1U & uVar26 + 1;
        bVar28 = true;
      }
    }
  } while (bVar28);
  *(short *)((long)plVar2 + 10) = (short)uVar18;
  if (uVar5 == 0) {
    piVar7 = (ixy_device *)0x0;
  }
  else {
    piVar14 = (ixy_device *)0x0;
    uVar6 = (uint)uVar22;
    do {
      uVar19 = (int)plVar2[1] - 1;
      uVar26 = uVar6 + 1 & uVar19;
      piVar7 = piVar14;
      if ((short)uVar18 == (short)uVar26) break;
      plVar25 = *(long **)(extraout_RDX_00 + (long)piVar14 * 8);
      plVar2[(ulong)(uVar6 & 0xffff) + 2] = (long)plVar25;
      *(ushort *)((long)plVar2 + 0xc) =
           (ushort)uVar19 & (short)*(undefined4 *)((long)plVar2 + 0xc) + 1U;
      lVar11 = *plVar2;
      uVar17 = (ulong)((uVar6 & 0xffff) << 4);
      *(long *)(lVar11 + uVar17) = *plVar25 + 0x40;
      *(uint *)(lVar11 + 8 + uVar17) = *(uint *)((long)plVar25 + 0x14) | 0x2b300000;
      *(int *)(lVar11 + 0xc + uVar17) = *(int *)((long)plVar25 + 0x14) << 0xe;
      piVar14 = (ixy_device *)((long)&piVar14->pci_addr + 1);
      piVar7 = (ixy_device *)(ulong)uVar5;
      uVar6 = uVar26;
    } while ((ixy_device *)(ulong)uVar5 != piVar14);
  }
  uStack_ec = (ushort)uVar15;
  *(uint *)(*(long *)&mempool[2].free_stack_top + 0x6018 + (ulong)uStack_ec * 0x40) =
       (uint)*(ushort *)((long)plVar2 + 0xc);
  return piVar7;
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->addr = pci_map_resource(pci_addr);
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}